

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int b64_pton(char *src,uchar *target,size_t targsize)

{
  char cVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  void *pvVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  
  bVar7 = true;
  uVar8 = 0;
  while( true ) {
    do {
      pcVar5 = src;
      cVar1 = *pcVar5;
      if ((long)cVar1 == 0) {
        if (bVar7) {
          return 0;
        }
        return -1;
      }
      src = pcVar5 + 1;
      ppuVar3 = __ctype_b_loc();
      puVar2 = *ppuVar3;
    } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    if (cVar1 == '=') break;
    pvVar4 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",(int)cVar1,
                    0x41);
    if (pvVar4 == (void *)0x0) {
      return -1;
    }
    bVar7 = false;
    uVar8 = 1;
    if (target != (uchar *)0x0) {
      if (targsize == 0) {
        return -1;
      }
      *target = ((char)pvVar4 + -0x60) * '\x04';
      bVar7 = false;
      uVar8 = 1;
    }
  }
  pcVar5 = pcVar5 + 2;
  if (uVar8 < 2) {
    return -1;
  }
  iVar6 = (int)*src;
  if (uVar8 != 2) goto LAB_00102d49;
  while( true ) {
    if (iVar6 == 0) {
      return -1;
    }
    if ((*(byte *)((long)puVar2 + (long)iVar6 * 2 + 1) & 0x20) == 0) break;
    iVar6 = (int)*pcVar5;
    pcVar5 = pcVar5 + 1;
  }
  if (iVar6 != 0x3d) {
    return -1;
  }
  while( true ) {
    iVar6 = (int)*pcVar5;
    pcVar5 = pcVar5 + 1;
LAB_00102d49:
    if (iVar6 == 0) break;
    if ((*(byte *)((long)puVar2 + (long)iVar6 * 2 + 1) & 0x20) == 0) {
      return -1;
    }
  }
  if (target == (uchar *)0x0) {
    return 0;
  }
  if (*target == '\0') {
    return 0;
  }
  return -1;
}

Assistant:

int
b64_pton(char const *src, unsigned char *target, size_t targsize) {
	int tarindex, state, ch;
	char *pos;

	state = 0;
	tarindex = 0;

	while ((ch = *src++) != '\0') {
		if (isspace(ch))	/* Skip whitespace anywhere. */
			continue;

		if (ch == Pad64)
			break;

		pos = strchr(Base64, ch);
		if (pos == 0) 		/* A non-base64 character. */
			return (-1);

		switch (state) {
		case 0:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] = (pos - Base64) << 2;
			}
			state = 1;
			break;
		case 1:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 4;
				target[tarindex+1]  = ((pos - Base64) & 0x0f)
							<< 4 ;
			}
			tarindex++;
			state = 2;
			break;
		case 2:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 2;
				target[tarindex+1]  = ((pos - Base64) & 0x03)
							<< 6;
			}
			tarindex++;
			state = 3;
			break;
		case 3:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] |= (pos - Base64);
			}
			tarindex++;
			state = 0;
			break;
		default:
			abort();
		}
	}

	/*
	 * We are done decoding Base-64 chars.  Let's see if we ended
	 * on a byte boundary, and/or with erroneous trailing characters.
	 */

	if (ch == Pad64) {		/* We got a pad char. */
		ch = *src++;		/* Skip it, get next. */
		switch (state) {
		case 0:		/* Invalid = in first position */
		case 1:		/* Invalid = in second position */
			return (-1);

		case 2:		/* Valid, means one byte of info */
			/* Skip any number of spaces. */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					break;
			/* Make sure there is another trailing = sign. */
			if (ch != Pad64)
				return (-1);
			ch = *src++;		/* Skip the = */
			/* Fall through to "single trailing =" case. */
			/* FALLTHROUGH */

		case 3:		/* Valid, means two bytes of info */
			/*
			 * We know this char is an =.  Is there anything but
			 * whitespace after it?
			 */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					return (-1);

			/*
			 * Now make sure for cases 2 and 3 that the "extra"
			 * bits that slopped past the last full byte were
			 * zeros.  If we don't check them, they become a
			 * subliminal channel.
			 */
			if (target && target[tarindex] != 0)
				return (-1);
		}
	} else {
		/*
		 * We ended by seeing the end of the string.  Make sure we
		 * have no partial bytes lying around.
		 */
		if (state != 0)
			return (-1);
	}

	return (tarindex);
}